

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O1

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int *piVar5;
  size_type sVar6;
  ulong uVar7;
  size_type __new_size;
  
  iVar1 = this->size_;
  if (-1 < iVar1) {
    iVar2 = this->max_size_;
    if (iVar2 < iVar1) {
LAB_0012ba40:
      __assert_fail("(size_) <= (max_size_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x1c5,
                    "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                   );
    }
    piVar3 = this->sparse_to_dense_;
    if (piVar3 != (int *)0x0 || iVar1 == 0) {
      if (iVar2 < new_max_size) {
        __new_size = (size_type)new_max_size;
        uVar7 = 0xffffffffffffffff;
        if (-1 < new_max_size) {
          uVar7 = __new_size * 4;
        }
        piVar5 = (int *)operator_new__(uVar7);
        if (piVar3 != (int *)0x0) {
          memmove(piVar5,piVar3,(long)iVar2 << 2);
          operator_delete__(piVar3);
        }
        this->sparse_to_dense_ = piVar5;
        std::
        vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
        ::resize(&this->dense_,__new_size);
        bVar4 = RunningOnValgrind();
        if ((bVar4) && (sVar6 = (size_type)this->max_size_, this->max_size_ < new_max_size)) {
          piVar3 = this->sparse_to_dense_;
          piVar5 = &(this->dense_).
                    super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar6].index_;
          do {
            piVar3[sVar6] = -0x54545455;
            *piVar5 = -0x54545455;
            sVar6 = sVar6 + 1;
            piVar5 = piVar5 + 4;
          } while (__new_size != sVar6);
        }
      }
      this->max_size_ = new_max_size;
      if (new_max_size < this->size_) {
        this->size_ = new_max_size;
      }
      iVar1 = this->size_;
      if (iVar1 < 0) goto LAB_0012ba21;
      if (new_max_size < iVar1) goto LAB_0012ba40;
      if ((iVar1 == 0) || (this->sparse_to_dense_ != (int *)0x0)) {
        return;
      }
    }
    __assert_fail("size_ == 0 || sparse_to_dense_ != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c6,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
LAB_0012ba21:
  __assert_fail("(0) <= (size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x1c4,
                "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
               );
}

Assistant:

void SparseArray<Value>::DebugCheckInvariants() const {
  DCHECK_LE(0, size_);
  DCHECK_LE(size_, max_size_);
  DCHECK(size_ == 0 || sparse_to_dense_ != NULL);
}